

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall wasm::Wasm2JSGlue::emitPre(Wasm2JSGlue *this)

{
  __uniq_ptr_data<wasm::Table,_std::default_delete<wasm::Table>,_true,_true> _Var1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  
  if ((this->flags).emscripten == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(this->out + 0x200),"function instantiate(info) {\n",0x1d);
  }
  else {
    emitPreES6(this);
  }
  bVar2 = isTableExported(this->wasm);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(this->out + 0x200),"function Table(ret) {\n",0x16);
    _Var1.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
    super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl =
         (((this->wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>;
    poVar5 = (ostream *)(this->out + 0x200);
    if (*(long *)((long)_Var1.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x38) ==
        *(long *)((long)_Var1.super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
                        super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl + 0x40)) {
      pcVar4 = "  // grow method not included; table is not growable\n";
      lVar3 = 0x35;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"  ret.grow = function(by) {\n",0x1c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    var old = this.length;\n",0x1b)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"    this.length = this.length + by;\n",0x24);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    return old;\n",0x10);
      pcVar4 = "  };\n";
      lVar3 = 5;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar4,lVar3);
    poVar5 = (ostream *)(this->out + 0x200);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"  ret.set = function(i, func) {\n",0x20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    this[i] = func;\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  };\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ret.get = function(i) {\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    return this[i];\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  };\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  return ret;\n",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}\n\n",3);
  }
  emitMemory(this);
  emitSpecialSupport(this);
  return;
}

Assistant:

void Wasm2JSGlue::emitPre() {
  if (flags.emscripten) {
    emitPreEmscripten();
  } else {
    emitPreES6();
  }

  if (isTableExported(wasm)) {
    out << "function Table(ret) {\n";
    if (wasm.tables[0]->initial == wasm.tables[0]->max) {
      out << "  // grow method not included; table is not growable\n";
    } else {
      out << "  ret.grow = function(by) {\n"
          << "    var old = this.length;\n"
          << "    this.length = this.length + by;\n"
          << "    return old;\n"
          << "  };\n";
    }
    out << "  ret.set = function(i, func) {\n"
        << "    this[i] = func;\n"
        << "  };\n"
        << "  ret.get = function(i) {\n"
        << "    return this[i];\n"
        << "  };\n"
        << "  return ret;\n"
        << "}\n\n";
  }

  emitMemory();
  emitSpecialSupport();
}